

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser.cc
# Opt level: O1

bool __thiscall
tinyusdz::ascii::AsciiParser::ParseBasicPrimAttr<tinyusdz::value::quatd>
          (AsciiParser *this,bool array_qual,string *primattr_name,Attribute *out_attr)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ostringstream oVar2;
  bool bVar3;
  bool bVar4;
  long *plVar5;
  ostream *poVar6;
  pointer pPVar7;
  byte bVar8;
  undefined7 in_register_00000031;
  undefined8 uVar9;
  _Alloc_hider _Var10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  ValueBlock noneval;
  vector<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_> value;
  PrimVar var;
  optional<tinyusdz::value::quatd> value_1;
  Attribute attr;
  AttrMeta meta;
  string local_6f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6d8;
  vector<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_> local_6b8;
  storage_union local_698;
  undefined **local_688;
  undefined1 local_680;
  undefined1 local_678 [32];
  undefined1 local_658 [16];
  undefined1 local_648 [360];
  undefined1 local_4e0 [40];
  _Alloc_hider local_4b8;
  size_type local_4b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4a8;
  storage_union local_498;
  vtable_type *local_488;
  bool local_480;
  vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
  local_478;
  bool local_460;
  vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> local_458;
  AttrMetas AStack_440;
  undefined1 local_238 [136];
  bool local_1b0;
  storage_t<double> local_1a8;
  bool local_1a0;
  storage_t<tinyusdz::Token> local_198;
  bool local_178;
  storage_t<tinyusdz::Token> local_170;
  bool local_150;
  storage_t<tinyusdz::Token> local_148;
  bool local_128;
  storage_t<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>_>
  local_120;
  bool local_f0;
  storage_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_e8;
  bool local_c8;
  storage_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_c0;
  bool local_a0;
  storage_t<tinyusdz::Token> local_98;
  _Rb_tree_node_base local_70;
  size_t local_50;
  pointer pSStack_48;
  pointer local_40;
  pointer pSStack_38;
  
  local_4e0._0_8_ = local_4e0 + 0x10;
  local_4e0._8_8_ = 0;
  local_4e0[0x10] = '\0';
  local_4e0._32_4_ = Varying;
  local_4e0[0x24] = false;
  local_4b8._M_p = (pointer)&local_4a8;
  local_4b0 = 0;
  local_4a8._M_local_buf[0] = '\0';
  local_488 = (vtable_type *)&linb::any::vtable_for_type<decltype(nullptr)>()::table;
  local_498.dynamic = (void *)0x0;
  local_480 = false;
  local_478.
  super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_478.
  super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  local_478.
  super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  local_478.
  super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  local_478.
  super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_ = 0;
  local_460 = false;
  AStack_440.interpolation.contained = (storage_t<tinyusdz::Interpolation>)0x0;
  AStack_440.elementSize.has_value_ = false;
  AStack_440.elementSize.contained = (storage_t<unsigned_int>)0x0;
  AStack_440.hidden.has_value_ = false;
  AStack_440.hidden.contained = (storage_t<bool>)0x0;
  AStack_440.comment.has_value_ = false;
  AStack_440.weight.contained = (storage_t<double>)0x0;
  AStack_440.connectability.has_value_ = false;
  AStack_440.bindMaterialAs.contained._16_8_ = 0;
  AStack_440.bindMaterialAs.contained._24_8_ = 0;
  AStack_440.bindMaterialAs.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
  AStack_440.bindMaterialAs.contained._8_8_ = 0;
  AStack_440.meta._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &AStack_440.meta._M_t._M_impl.super__Rb_tree_header._M_header;
  AStack_440.meta._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  AStack_440.meta._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  AStack_440.comment.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
  AStack_440.comment.contained._8_8_ = 0;
  AStack_440.comment.contained._16_8_ = 0;
  AStack_440.comment.contained._24_8_ = 0;
  AStack_440.comment.contained._32_8_ = 0;
  AStack_440.comment.contained._40_8_ = 0;
  AStack_440.customData.has_value_ = false;
  AStack_440.customData.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
  AStack_440.customData.contained._8_8_ = 0;
  AStack_440.customData.contained._16_8_ = 0;
  AStack_440.customData.contained._24_8_ = 0;
  AStack_440.customData.contained._32_8_ = 0;
  AStack_440.customData.contained._40_8_ = 0;
  AStack_440.weight.has_value_ = false;
  AStack_440.connectability.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
  AStack_440.connectability.contained._8_8_ = 0;
  AStack_440.connectability.contained._16_8_ = 0;
  AStack_440.connectability.contained._24_8_ = 0;
  AStack_440.outputName.has_value_ = false;
  AStack_440.outputName.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
  AStack_440.outputName.contained._8_8_ = 0;
  AStack_440.outputName.contained._16_8_ = 0;
  AStack_440.outputName.contained._24_8_ = 0;
  AStack_440.renderType.has_value_ = false;
  AStack_440.sdrMetadata.has_value_ = false;
  AStack_440.renderType.contained._16_8_ = 0;
  AStack_440.renderType.contained._24_8_ = 0;
  AStack_440.renderType.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
  AStack_440.renderType.contained._8_8_ = 0;
  AStack_440.displayName.has_value_ = false;
  AStack_440.sdrMetadata.contained._32_8_ = 0;
  AStack_440.sdrMetadata.contained._40_8_ = 0;
  AStack_440.sdrMetadata.contained._16_8_ = 0;
  AStack_440.sdrMetadata.contained._24_8_ = 0;
  AStack_440.sdrMetadata.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
  AStack_440.sdrMetadata.contained._8_8_ = 0;
  AStack_440.displayGroup.has_value_ = false;
  AStack_440.displayName.contained._16_8_ = 0;
  AStack_440.displayName.contained._24_8_ = 0;
  AStack_440.displayName.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
  AStack_440.displayName.contained._8_8_ = 0;
  AStack_440.bindMaterialAs.has_value_ = false;
  AStack_440.displayGroup.contained._16_8_ = 0;
  AStack_440.displayGroup.contained._24_8_ = 0;
  AStack_440.displayGroup.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
  AStack_440.displayGroup.contained._8_8_ = 0;
  local_458.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  local_458.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._1_7_ = 0;
  AStack_440.interpolation.has_value_ = false;
  local_458.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_458.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
  super__Vector_impl_data._M_finish._0_1_ = 0;
  local_458.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
  super__Vector_impl_data._M_finish._1_7_ = 0;
  AStack_440.meta._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  AStack_440.stringData.
  super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  AStack_440.stringData.
  super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  AStack_440.stringData.
  super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_688 = &linb::any::vtable_for_type<decltype(nullptr)>()::table;
  local_698.dynamic = (void *)0x0;
  local_680 = 0;
  local_678._0_8_ = (pointer)0x0;
  local_678[8] = 0;
  local_678._9_7_ = 0;
  local_678[0x10] = 0;
  local_678._17_8_ = 0;
  AStack_440.meta._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       AStack_440.meta._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((int)CONCAT71(in_register_00000031,array_qual) == 0) {
    local_658._0_8_ = local_658._0_8_ & 0xffffffffffffff00;
    local_658._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    local_648._0_8_ = (pointer)0x0;
    local_648._8_8_ = 0;
    local_648._16_8_ = 0;
    bVar3 = ReadBasicType(this,(optional<tinyusdz::value::quatd> *)local_658);
    if (bVar3) {
      oVar2 = local_658[0];
      if (local_658[0] == (ostringstream)0x1) {
        linb::any::operator=((any *)&local_698,(quatd *)(local_658 + 8));
      }
      bVar8 = (byte)oVar2 ^ 1;
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_238);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_238,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_238,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                 ,0x56);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_238,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_238,"ParseBasicPrimAttr",0x12);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_238,"():",3);
      poVar6 = (ostream *)::std::ostream::operator<<((ostringstream *)local_238,0xe2f);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
      local_6d8.field_2._M_allocated_capacity._0_4_ = 0x74617571;
      local_6d8.field_2._M_allocated_capacity._4_2_ = 100;
      local_6d8._M_string_length = 5;
      local_6d8._M_dataplus._M_p = (pointer)&local_6d8.field_2;
      plVar5 = (long *)::std::__cxx11::string::replace((ulong)&local_6d8,0,(char *)0x0,0x440cda);
      paVar1 = &local_6f8.field_2;
      pPVar7 = (pointer)(plVar5 + 2);
      if ((pointer)*plVar5 == pPVar7) {
        local_6f8.field_2._M_allocated_capacity = (size_type)(pPVar7->_prim_part)._M_dataplus._M_p;
        local_6f8.field_2._8_8_ = plVar5[3];
        local_6f8._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_6f8.field_2._M_allocated_capacity = (size_type)(pPVar7->_prim_part)._M_dataplus._M_p;
        local_6f8._M_dataplus._M_p = (pointer)*plVar5;
      }
      local_6f8._M_string_length = plVar5[1];
      *plVar5 = (long)pPVar7;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      poVar6 = ::std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_238,local_6f8._M_dataplus._M_p,local_6f8._M_string_length
                         );
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_6f8._M_dataplus._M_p != paVar1) {
        operator_delete(local_6f8._M_dataplus._M_p,
                        (ulong)(local_6f8.field_2._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_6d8._M_dataplus._M_p != &local_6d8.field_2) {
        operator_delete(local_6d8._M_dataplus._M_p,
                        CONCAT26(local_6d8.field_2._M_allocated_capacity._6_2_,
                                 CONCAT24(local_6d8.field_2._M_allocated_capacity._4_2_,
                                          local_6d8.field_2._M_allocated_capacity._0_4_)) + 1);
      }
      ::std::__cxx11::stringbuf::str();
      PushError(this,&local_6f8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_6f8._M_dataplus._M_p != paVar1) {
        operator_delete(local_6f8._M_dataplus._M_p,
                        (ulong)(local_6f8.field_2._M_allocated_capacity + 1));
      }
      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_238);
      ::std::ios_base::~ios_base((ios_base *)(local_238 + 0x70));
      bVar8 = 0;
    }
    if (!bVar3) {
      bVar3 = false;
      goto LAB_003e179b;
    }
  }
  else {
    bVar3 = MaybeNone(this);
    if (bVar3) {
      bVar8 = 0;
    }
    else {
      local_6b8.super__Vector_base<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_6b8.super__Vector_base<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_6b8.super__Vector_base<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      bVar4 = ParseBasicTypeArray<tinyusdz::value::quatd>(this,&local_6b8);
      if (bVar4) {
        linb::any::operator=((any *)&local_698,&local_6b8);
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_238);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_238,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_238,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_238,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_238,"ParseBasicPrimAttr",0x12);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_238,"():",3);
        poVar6 = (ostream *)::std::ostream::operator<<((ostringstream *)local_238,0xdf9);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
        local_6f8._M_dataplus._M_p = (pointer)&local_6f8.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_6f8,"Failed to parse Primtive Attribute {} type = {}[]","");
        local_6d8.field_2._M_allocated_capacity._0_4_ = 0x74617571;
        local_6d8.field_2._M_allocated_capacity._4_2_ = 100;
        local_6d8._M_string_length = 5;
        local_6d8._M_dataplus._M_p = (pointer)&local_6d8.field_2;
        fmt::format<std::__cxx11::string,std::__cxx11::string>
                  ((string *)local_658,(fmt *)&local_6f8,primattr_name,&local_6d8,in_R8);
        poVar6 = ::std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_238,(char *)local_658._0_8_,local_658._8_8_);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
        if ((pointer)local_658._0_8_ != (pointer)(local_658 + 0x10)) {
          operator_delete((void *)local_658._0_8_,(ulong)(local_648._0_8_ + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_6d8._M_dataplus._M_p != &local_6d8.field_2) {
          operator_delete(local_6d8._M_dataplus._M_p,
                          CONCAT26(local_6d8.field_2._M_allocated_capacity._6_2_,
                                   CONCAT24(local_6d8.field_2._M_allocated_capacity._4_2_,
                                            local_6d8.field_2._M_allocated_capacity._0_4_)) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_6f8._M_dataplus._M_p != &local_6f8.field_2) {
          operator_delete(local_6f8._M_dataplus._M_p,
                          (ulong)(local_6f8.field_2._M_allocated_capacity + 1));
        }
        ::std::__cxx11::stringbuf::str();
        PushError(this,(string *)local_658);
        if ((pointer)local_658._0_8_ != (pointer)(local_658 + 0x10)) {
          operator_delete((void *)local_658._0_8_,(ulong)(local_648._0_8_ + 1));
        }
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_238);
        ::std::ios_base::~ios_base((ios_base *)(local_238 + 0x70));
      }
      if (local_6b8.
          super__Vector_base<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_6b8.
                        super__Vector_base<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_6b8.
                              super__Vector_base<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_6b8.
                              super__Vector_base<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      bVar3 = false;
      bVar8 = bVar3;
      if (!bVar4) goto LAB_003e179b;
    }
  }
  local_70._M_left = &local_70;
  local_238[0] = (ostringstream)0x0;
  local_238._4_4_ = (storage_t<tinyusdz::Interpolation>)0x0;
  local_238[8] = false;
  local_238._12_4_ = (storage_t<unsigned_int>)0x0;
  local_238[0x10] = false;
  local_238[0x11] = (storage_t<bool>)0x0;
  local_238[0x18] = false;
  local_1a8 = (storage_t<double>)0x0;
  local_1a0 = false;
  local_98.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
  local_98._8_8_ = 0;
  local_98._16_8_ = 0;
  local_98._24_8_ = 0;
  local_70._M_color = _S_red;
  local_70._M_parent = (_Base_ptr)0x0;
  local_238._32_8_ = (anon_struct_8_0_00000001_for___align)0x0;
  local_238._40_8_ = 0;
  local_238._48_8_ = 0;
  local_238._56_8_ = 0;
  local_238._64_8_ = 0;
  local_238._72_8_ = 0;
  local_238[0x50] = false;
  local_238._88_8_ = (anon_struct_8_0_00000001_for___align)0x0;
  local_238._96_8_ = 0;
  local_238._104_8_ = 0;
  local_238._112_8_ = 0;
  local_238._120_8_ = 0;
  local_238._128_8_ = 0;
  local_1b0 = false;
  local_178 = false;
  local_198._16_8_ = 0;
  local_198._24_8_ = 0;
  local_198.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
  local_198._8_8_ = 0;
  local_170.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
  local_170._8_8_ = 0;
  local_170._16_8_ = 0;
  local_170._24_8_ = 0;
  local_150 = false;
  local_148.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
  local_148._8_8_ = 0;
  local_148._16_8_ = 0;
  local_148._24_8_ = 0;
  local_128 = false;
  local_120.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
  local_120._8_8_ = 0;
  local_120._16_8_ = 0;
  local_120._24_8_ = 0;
  local_120._32_8_ = 0;
  local_120._40_8_ = 0;
  local_f0 = false;
  local_e8.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
  local_e8._8_8_ = 0;
  local_e8._16_8_ = 0;
  local_e8._24_8_ = 0;
  local_c8 = false;
  local_c0.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
  local_c0._8_8_ = 0;
  local_c0._16_8_ = 0;
  local_c0._24_8_ = 0;
  local_a0 = false;
  local_50 = 0;
  pSStack_48 = (pointer)0x0;
  local_40 = (pointer)0x0;
  pSStack_38 = (pointer)0x0;
  local_70._M_right = local_70._M_left;
  bVar3 = ParseAttrMeta(this,(AttrMeta *)local_238);
  if (bVar3) {
    AttrMetas::operator=(&AStack_440,(AttrMetas *)local_238);
    if (bVar8 == 0) {
      Attribute::set_var((Attribute *)local_4e0,(PrimVar *)&local_698);
    }
    else {
      Attribute::set_value<tinyusdz::value::ValueBlock>
                ((Attribute *)local_4e0,(ValueBlock *)&local_6d8);
      local_480 = true;
      if (array_qual) {
        local_6f8.field_2._M_allocated_capacity._0_6_ = 0x6474617571;
        local_6f8._M_string_length = 5;
        local_6f8._M_dataplus._M_p = (pointer)&local_6f8.field_2;
        plVar5 = (long *)::std::__cxx11::string::append((char *)&local_6f8);
        pPVar7 = (pointer)(plVar5 + 2);
        if ((pointer)*plVar5 == pPVar7) {
          local_648._0_8_ = (pPVar7->_prim_part)._M_dataplus._M_p;
          local_648._8_8_ = plVar5[3];
          local_658._0_8_ = (pointer)(local_658 + 0x10);
        }
        else {
          local_648._0_8_ = (pPVar7->_prim_part)._M_dataplus._M_p;
          local_658._0_8_ = (pointer)*plVar5;
        }
        local_658._8_8_ = *(anon_struct_8_0_00000001_for___align *)(plVar5 + 1);
        *plVar5 = (long)pPVar7;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        ::std::__cxx11::string::_M_assign((string *)&local_4b8);
        if ((pointer)local_658._0_8_ != (pointer)(local_658 + 0x10)) {
          operator_delete((void *)local_658._0_8_,(ulong)(local_648._0_8_ + 1));
        }
        uVar9 = local_6f8.field_2._M_allocated_capacity;
        _Var10._M_p = local_6f8._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_6f8._M_dataplus._M_p != &local_6f8.field_2) {
LAB_003e1632:
          operator_delete(_Var10._M_p,
                          (ulong)((long)&(((pointer)uVar9)->_prim_part)._M_dataplus._M_p + 1));
        }
      }
      else {
        local_648._0_6_ = 0x6474617571;
        local_658._8_8_ = (anon_struct_8_0_00000001_for___align)0x5;
        local_658._0_8_ = (pointer)(local_658 + 0x10);
        ::std::__cxx11::string::_M_assign((string *)&local_4b8);
        uVar9 = local_648._0_8_;
        _Var10._M_p = (pointer)local_658._0_8_;
        if ((pointer)local_658._0_8_ != (pointer)(local_658 + 0x10)) goto LAB_003e1632;
      }
    }
    ::std::__cxx11::string::operator=((string *)out_attr,(string *)local_4e0);
    out_attr->_variability = local_4e0._32_4_;
    out_attr->_varying_authored = local_4e0[0x24];
    ::std::__cxx11::string::operator=((string *)&out_attr->_type_name,(string *)&local_4b8);
    linb::any::operator=((any *)&out_attr->_var,(any *)&local_498);
    (out_attr->_var)._blocked = local_480;
    local_658._0_8_ =
         (out_attr->_var)._ts._samples.
         super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_658._8_8_ =
         *(anon_struct_8_0_00000001_for___align *)
          &(out_attr->_var)._ts._samples.
           super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
           ._M_impl.super__Vector_impl_data._M_finish;
    local_648._0_8_ =
         (out_attr->_var)._ts._samples.
         super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (out_attr->_var)._ts._samples.
    super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
    ._M_impl.super__Vector_impl_data._M_start =
         local_478.
         super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
         ._M_impl.super__Vector_impl_data._M_start;
    (out_attr->_var)._ts._samples.
    super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (pointer)CONCAT71(local_478.
                           super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                           ._M_impl.super__Vector_impl_data._M_finish._1_7_,
                           local_478.
                           super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                           ._M_impl.super__Vector_impl_data._M_finish._0_1_);
    (out_attr->_var)._ts._samples.
    super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)CONCAT71(local_478.
                           super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_,
                           local_478.
                           super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_);
    local_478.
    super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_478.
    super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
    ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
    local_478.
    super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
    ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
    local_478.
    super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
    local_478.
    super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_ = 0;
    ::std::
    vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
    ::~vector((vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
               *)local_658);
    (out_attr->_var)._ts._dirty = local_460;
    local_658._0_8_ =
         (out_attr->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
         _M_impl.super__Vector_impl_data._M_start;
    local_658._8_8_ =
         (out_attr->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    local_648._0_8_ =
         (out_attr->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
    (out_attr->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_458.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
         super__Vector_impl_data._M_start;
    (out_attr->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (pointer)CONCAT71(local_458.
                           super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
                           _M_impl.super__Vector_impl_data._M_finish._1_7_,
                           local_458.
                           super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
                           _M_impl.super__Vector_impl_data._M_finish._0_1_);
    (out_attr->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)CONCAT71(local_458.
                           super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage._1_7_,
                           local_458.
                           super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage._0_1_);
    local_458.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_458.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
    super__Vector_impl_data._M_finish._0_1_ = 0;
    local_458.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
    super__Vector_impl_data._M_finish._1_7_ = 0;
    local_458.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
    local_458.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._1_7_ = 0;
    ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::~vector
              ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_658);
    AttrMetas::operator=(&out_attr->_metas,&AStack_440);
  }
  else {
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_658);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_658,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_658,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
               ,0x56);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_658,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_658,"ParseBasicPrimAttr",0x12);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_658,"():",3);
    poVar6 = (ostream *)::std::ostream::operator<<((ostringstream *)local_658,0xe43);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_658,"Failed to parse Attribute meta.",0x1f);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_658,"\n",1);
    ::std::__cxx11::stringbuf::str();
    PushError(this,&local_6f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_6f8._M_dataplus._M_p != &local_6f8.field_2) {
      operator_delete(local_6f8._M_dataplus._M_p,
                      (ulong)(local_6f8.field_2._M_allocated_capacity + 1));
    }
    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_658);
    ::std::ios_base::~ios_base((ios_base *)(local_648 + 0x60));
  }
  AttrMetas::~AttrMetas((AttrMetas *)local_238);
LAB_003e179b:
  ::std::
  vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
  ::~vector((vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
             *)local_678);
  if (local_688 != (undefined **)0x0) {
    (*(code *)local_688[4])(&local_698);
    local_688 = (undefined **)0x0;
  }
  AttrMetas::~AttrMetas(&AStack_440);
  ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::~vector(&local_458);
  ::std::
  vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
  ::~vector(&local_478);
  if (local_488 != (vtable_type *)0x0) {
    (*local_488->destroy)(&local_498);
    local_488 = (vtable_type *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4b8._M_p != &local_4a8) {
    operator_delete(local_4b8._M_p,
                    CONCAT71(local_4a8._M_allocated_capacity._1_7_,local_4a8._M_local_buf[0]) + 1);
  }
  if ((undefined1 *)local_4e0._0_8_ != local_4e0 + 0x10) {
    operator_delete((void *)local_4e0._0_8_,CONCAT71(local_4e0._17_7_,local_4e0[0x10]) + 1);
  }
  return bVar3;
}

Assistant:

bool AsciiParser::ParseBasicPrimAttr(bool array_qual,
                                     const std::string &primattr_name,
                                     Attribute *out_attr) {
  Attribute attr;
  primvar::PrimVar var;
  bool blocked{false};

  if (array_qual) {
    if (MaybeNone()) {
    } else {
      std::vector<T> value;
      if (!ParseBasicTypeArray(&value)) {
        PUSH_ERROR_AND_RETURN(fmt::format("Failed to parse Primtive Attribute {} type = {}[]", primattr_name,
                              std::string(value::TypeTraits<T>::type_name())));
      }

      // Empty array allowed.
      DCOUT("Got it: primatrr " << primattr_name << ", ty = " + std::string(value::TypeTraits<T>::type_name()) +
            ", sz = " + std::to_string(value.size()));
      var.set_value(value);
    }

#if 0
  // FIXME: Disable duplicated parsing attribute connection here, since parsing attribute connection will be handled in ParsePrimProps().
  } else if (hasConnect(primattr_name)) {
    std::string value;  // TODO: Use Path
    if (!ReadPathIdentifier(&value)) {
      PUSH_ERROR_AND_RETURN("Failed to parse path identifier.");
    }

    // validate.
    Path connectionPath = pathutil::FromString(value);
    if (!connectionPath.is_valid()) {
      PUSH_ERROR_AND_RETURN(fmt::format("Invalid connectionPath: {}.", value));
    }

    // Resolve relative path here.
    // NOTE: Internally, USD(Crate) does not allow relative path.
    Path base_prim_path(GetCurrentPrimPath(), "");
    Path abs_path;
    if (!pathutil::ResolveRelativePath(base_prim_path, connectionPath,
                                       &abs_path)) {
      PUSH_ERROR_AND_RETURN(fmt::format("Invalid relative Path: {}.", value));
    }

    // TODO: Use Path
    var.set_value(abs_path.full_path_name());

    // Check if attribute metadatum is not authored.
    if (!SkipCommentAndWhitespaceAndNewline()) {
      return false;
    }

    char c;
    if (!LookChar1(&c)) {
      return false;
    }

    if (c == '(') {
      PUSH_ERROR_AND_RETURN(fmt::format("Attribute connection cannot have attribute metadataum: {}", primattr_name));
    }

#endif
  } else {
    nonstd::optional<T> value;
    if (!ReadBasicType(&value)) {
      PUSH_ERROR_AND_RETURN("Failed to parse " +
                            std::string(value::TypeTraits<T>::type_name()));
    }

    if (value) {
      DCOUT("ParseBasicPrimAttr: " << value::TypeTraits<T>::type_name() << " = "
                                   << (*value));

      var.set_value(value.value());

    } else {
      blocked = true;
      // std::cout << "ParseBasicPrimAttr: " <<
      // value::TypeTraits<T>::type_name()
      //           << " = None\n";
    }
  }

  // optional: attribute meta.
  AttrMeta meta;
  if (!ParseAttrMeta(&meta)) {
    PUSH_ERROR_AND_RETURN("Failed to parse Attribute meta.");
  }
  attr.metas() = meta;

  if (blocked) {
    // There is still have a type for ValueBlock.
    value::ValueBlock noneval;
    attr.set_value(noneval);
    attr.set_blocked(true);
    if (array_qual) {
      attr.set_type_name(value::TypeTraits<T>::type_name() + "[]");
    } else {
      attr.set_type_name(value::TypeTraits<T>::type_name());
    }
  } else {
    attr.set_var(std::move(var));
  }

  (*out_attr) = std::move(attr);

  return true;
}